

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void opengv::relative_pose::modules::ge_main2
               (Matrix3d *xxF,Matrix3d *yyF,Matrix3d *zzF,Matrix3d *xyF,Matrix3d *yzF,Matrix3d *zxF,
               Matrix<double,_3,_9,_0,_3,_9> *x1P,Matrix<double,_3,_9,_0,_3,_9> *y1P,
               Matrix<double,_3,_9,_0,_3,_9> *z1P,Matrix<double,_3,_9,_0,_3,_9> *x2P,
               Matrix<double,_3,_9,_0,_3,_9> *y2P,Matrix<double,_3,_9,_0,_3,_9> *z2P,
               Matrix<double,_9,_9,_0,_9,_9> *m11P,Matrix<double,_9,_9,_0,_9,_9> *m12P,
               Matrix<double,_9,_9,_0,_9,_9> *m22P,cayley_t *startingPoint,geOutput_t *output)

{
  double dVar1;
  bool bVar2;
  int iVar3;
  size_t i;
  long lVar4;
  uint uVar5;
  long lVar6;
  complex<double> *__return_storage_ptr__;
  PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *this;
  double dVar7;
  double dVar8;
  undefined8 uVar11;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  Matrix4d G;
  Matrix<std::complex<double>,_4,_1,_0,_4,_1> D_complex;
  Vector4d t;
  Matrix<std::complex<double>,_4,_4,_0,_4,_4> V_complex;
  EigenSolver<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> Eig;
  Matrix4d V;
  double local_7f0;
  Matrix<double,_3,_1,_0,_3,_1> local_7d0;
  double local_7b0;
  undefined8 uStack_7a8;
  double local_7a0 [4];
  Matrix4d local_780;
  double local_700 [8];
  double local_6c0;
  double dStack_6b8;
  double dStack_6b0;
  double dStack_6a8;
  rotation_t local_690;
  Matrix<double,_1,_3,_1,_1,_3> local_640 [10];
  undefined1 local_540 [1088];
  Matrix<double,_4,_4,_0,_4,_4> local_100;
  
  this = (PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&local_100;
  uVar5 = 0;
  bVar2 = false;
  dVar8 = 0.3;
  uVar11 = 0;
  do {
    if ((bVar2) || (4 < uVar5)) {
      ge::composeG(&local_780,xxF,yyF,zzF,xyF,yzF,zxF,x1P,y1P,z1P,x2P,y2P,z2P,m11P,m12P,m22P,
                   &local_7d0);
      Eigen::EigenSolver<Eigen::Matrix<double,4,4,0,4,4>>::
      EigenSolver<Eigen::Matrix<double,4,4,0,4,4>>
                ((EigenSolver<Eigen::Matrix<double,4,4,0,4,4>> *)local_540,
                 (EigenBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)&local_780,true);
      __return_storage_ptr__ = (complex<double> *)local_640;
      local_700[0] = (double)local_540._128_8_;
      local_700[1] = (double)local_540._136_8_;
      local_700[2] = (double)local_540._144_8_;
      local_700[3] = (double)local_540._152_8_;
      local_700[4] = (double)local_540._160_8_;
      local_700[5] = (double)local_540._168_8_;
      local_700[6] = (double)local_540._176_8_;
      local_700[7] = (double)local_540._184_8_;
      Eigen::EigenSolver<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::eigenvectors
                ((EigenvectorsType *)__return_storage_ptr__,
                 (EigenSolver<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)local_540);
      for (lVar4 = 0; lVar4 != 4; lVar4 = lVar4 + 1) {
        local_7a0[lVar4] = local_700[lVar4 * 2];
        for (lVar6 = 0; lVar6 != 0x80; lVar6 = lVar6 + 0x20) {
          *(undefined8 *)(this + lVar6) =
               *(undefined8 *)
                ((((PlainObjectBase<Eigen::Matrix<std::complex<double>,_4,_4,_0,_4,_4>_> *)
                  __return_storage_ptr__->_M_value)->m_storage).m_data.array[0]._M_value + lVar6 * 2
                );
        }
        this = this + 8;
        __return_storage_ptr__ = __return_storage_ptr__ + 1;
      }
      local_690.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [2] = 1.0 / local_100.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                  m_data.array[3];
      local_690.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [6] = 0.0;
      local_690.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [7] = 0.0;
      local_690.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [8] = 1.97626258336499e-323;
      local_690.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [3] = (double)&local_100;
      local_690.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [5] = (double)&local_100;
      Eigen::PlainObjectBase<Eigen::Matrix<double,4,1,0,4,1>>::
      _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,4,1,0,4,1>const>const,Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,4,1,true>const>>
                ((PlainObjectBase<Eigen::Matrix<double,4,1,0,4,1>> *)&local_6c0,
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>_>_>
                  *)&local_690);
      (output->translation).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[0] = local_6c0;
      (output->translation).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[1] = dStack_6b8;
      (output->translation).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[2] = dStack_6b0;
      (output->translation).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[3] = dStack_6a8;
      math::cayley2rot(&local_690,&local_7d0);
      (output->rotation).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
      m_data.array[8] =
           local_690.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[8];
      (output->rotation).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
      m_data.array[0] =
           local_690.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[0];
      (output->rotation).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
      m_data.array[1] =
           local_690.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[1];
      (output->rotation).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
      m_data.array[2] =
           local_690.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[2];
      (output->rotation).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
      m_data.array[3] =
           local_690.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[3];
      (output->rotation).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
      m_data.array[4] =
           local_690.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[4];
      (output->rotation).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
      m_data.array[5] =
           local_690.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[5];
      (output->rotation).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
      m_data.array[6] =
           local_690.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[6];
      (output->rotation).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
      m_data.array[7] =
           local_690.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[7];
      (output->eigenvalues).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[0] = local_7a0[0];
      (output->eigenvalues).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[1] = local_7a0[1];
      (output->eigenvalues).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[2] = local_7a0[2];
      (output->eigenvalues).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[3] = local_7a0[3];
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,4,4,0,4,4>,Eigen::Matrix<double,4,4,0,4,4>>
                (&output->eigenvectors,&local_100);
      return;
    }
    local_7b0 = dVar8;
    uStack_7a8 = uVar11;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::Matrix<double,3,1,0,3,1>>
              (&local_7d0,startingPoint);
    local_7b0 = (double)((ulong)(2 < uVar5) * 0x3fe3333333333333 +
                        (ulong)(2 >= uVar5) * (long)local_7b0);
    uStack_7a8 = 0;
    if (uVar5 != 0) {
      iVar3 = rand();
      dVar8 = (double)iVar3 / 2147483647.0 + -0.5;
      local_540._0_8_ = (dVar8 + dVar8) * local_7b0;
      iVar3 = rand();
      dVar8 = (double)iVar3 / 2147483647.0 + -0.5;
      local_540._8_8_ = (dVar8 + dVar8) * local_7b0;
      iVar3 = rand();
      dVar8 = (double)iVar3 / 2147483647.0 + -0.5;
      local_540._16_8_ = (dVar8 + dVar8) * local_7b0;
      Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator+=
                ((MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)&local_7d0,
                 (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_540);
    }
    local_7f0 = ge::getCost(xxF,yyF,zzF,xyF,yzF,zxF,x1P,y1P,z1P,x2P,y2P,z2P,m11P,m12P,m22P,
                            &local_7d0,1);
    dVar8 = 0.01;
    iVar3 = 0;
    do {
      if (iVar3 == 0x32) break;
      ge::getQuickJacobian
                (xxF,yyF,zzF,xyF,yzF,zxF,x1P,y1P,z1P,x2P,y2P,z2P,m11P,m12P,m22P,&local_7d0,local_7f0
                 ,local_640,1);
      local_540._24_8_ = local_640;
      auVar9._8_8_ = 0;
      auVar9._0_8_ = local_640[0].super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
                     m_storage.m_data.array[0] *
                     local_640[0].super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
                     m_storage.m_data.array[0] +
                     local_640[0].super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
                     m_storage.m_data.array[1] *
                     local_640[0].super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
                     m_storage.m_data.array[1] +
                     local_640[0].super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
                     m_storage.m_data.array[2] *
                     local_640[0].super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
                     m_storage.m_data.array[2];
      auVar9 = vsqrtsd_avx(auVar9,auVar9);
      local_540._16_8_ = 1.0 / auVar9._0_8_;
      Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
      _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Transpose<Eigen::Matrix<double,1,3,1,1,3>>const>>
                ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&local_780,
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_>
                  *)local_540);
      local_540._0_8_ = &local_7d0;
      local_540._32_8_ = &local_780;
      local_540._24_8_ = dVar8;
      Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
      _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const>>
                (this,(DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
                       *)local_540);
      dVar7 = ge::getCost(xxF,yyF,zzF,xyF,yzF,zxF,x1P,y1P,z1P,x2P,y2P,z2P,m11P,m12P,m22P,
                          (cayley_t *)this,1);
      if (iVar3 == 0) {
        while ((dVar7 < local_7f0 && (dVar1 = dVar8 + dVar8, local_7f0 = dVar7, dVar1 <= 0.08))) {
          local_540._32_8_ = &local_780;
          local_540._0_8_ = &local_7d0;
          local_540._24_8_ = dVar1;
          Eigen::internal::
          call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const>>
                    ((Matrix<double,_3,_1,_0,_3,_1> *)this,
                     (CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                      *)local_540);
          dVar7 = ge::getCost(xxF,yyF,zzF,xyF,yzF,zxF,x1P,y1P,z1P,x2P,y2P,z2P,m11P,m12P,m22P,
                              (cayley_t *)this,1);
          dVar8 = dVar1;
        }
      }
      while (local_7f0 < dVar7) {
        dVar8 = dVar8 * 0.5;
        local_540._32_8_ = &local_780;
        local_540._0_8_ = &local_7d0;
        local_540._24_8_ = dVar8;
        Eigen::internal::
        call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const>>
                  ((Matrix<double,_3,_1,_0,_3,_1> *)this,
                   (CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                    *)local_540);
        dVar7 = ge::getCost(xxF,yyF,zzF,xyF,yzF,zxF,x1P,y1P,z1P,x2P,y2P,z2P,m11P,m12P,m22P,
                            (cayley_t *)this,1);
      }
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::Matrix<double,3,1,0,3,1>>
                (&local_7d0,(Matrix<double,_3,_1,_0,_3,_1> *)this);
      iVar3 = iVar3 + 1;
      local_7f0 = dVar7;
    } while (1e-05 <= dVar8);
    bVar2 = true;
    auVar10._8_8_ = 0;
    auVar10._0_8_ =
         local_7d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
         array[2] *
         local_7d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
         array[2] +
         local_7d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
         array[0] *
         local_7d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
         array[0] +
         local_7d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
         array[1] *
         local_7d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
         array[1];
    auVar9 = vsqrtsd_avx(auVar10,auVar10);
    dVar8 = local_7b0;
    uVar11 = uStack_7a8;
    if (auVar9._0_8_ < 0.01) {
      dVar8 = ge::getCost(xxF,yyF,zzF,xyF,yzF,zxF,x1P,y1P,z1P,x2P,y2P,z2P,m11P,m12P,m22P,&local_7d0,
                          0);
      bVar2 = dVar8 <= 0.001;
      uVar5 = uVar5 + (0.001 < dVar8);
      dVar8 = local_7b0;
      uVar11 = uStack_7a8;
    }
  } while( true );
}

Assistant:

void
opengv::relative_pose::modules::ge_main2(
    const Eigen::Matrix3d & xxF,
    const Eigen::Matrix3d & yyF,
    const Eigen::Matrix3d & zzF,
    const Eigen::Matrix3d & xyF,
    const Eigen::Matrix3d & yzF,
    const Eigen::Matrix3d & zxF,
    const Eigen::Matrix<double,3,9> & x1P,
    const Eigen::Matrix<double,3,9> & y1P,
    const Eigen::Matrix<double,3,9> & z1P,
    const Eigen::Matrix<double,3,9> & x2P,
    const Eigen::Matrix<double,3,9> & y2P,
    const Eigen::Matrix<double,3,9> & z2P,
    const Eigen::Matrix<double,9,9> & m11P,
    const Eigen::Matrix<double,9,9> & m12P,
    const Eigen::Matrix<double,9,9> & m22P,
    const cayley_t & startingPoint,
    geOutput_t & output )
{
  //todo: the optimization strategy is something that can possibly be improved:
  //-one idea is to check the gradient at the new sampling point, if that derives
  // too much, we have to stop
  //-another idea consists of having linear change of lambda, instead of exponential (safer, but slower)
  
  double lambda = 0.01;
  double maxLambda = 0.08;
  double modifier = 2.0;
  int maxIterations = 50;
  double min_xtol = 0.00001;
  bool disablingIncrements = true;
  bool print = false;

  cayley_t cayley;
  
  double disturbanceAmplitude = 0.3;
  bool found = false;
  int randomTrialCount = 0;
  
  while( !found && randomTrialCount < 5 )
  {
    if(randomTrialCount > 2)
      disturbanceAmplitude = 0.6;
	
    if( randomTrialCount == 0 )
      cayley = startingPoint;
    else
    {
      cayley = startingPoint;
      Eigen::Vector3d disturbance;
      disturbance[0] = (((double) rand())/ ((double) RAND_MAX)-0.5)*2.0*disturbanceAmplitude;
      disturbance[1] = (((double) rand())/ ((double) RAND_MAX)-0.5)*2.0*disturbanceAmplitude;
      disturbance[2] = (((double) rand())/ ((double) RAND_MAX)-0.5)*2.0*disturbanceAmplitude;
      cayley += disturbance;
    }
	
    lambda = 0.01;
    int iterations = 0;
    double smallestEV = ge::getCost(xxF,yyF,zzF,xyF,yzF,zxF,
        x1P,y1P,z1P,x2P,y2P,z2P,m11P,m12P,m22P,cayley,1);
    
    while( iterations < maxIterations )
    {
      Eigen::Matrix<double,1,3> jacobian;
      ge::getQuickJacobian(xxF,yyF,zzF,xyF,yzF,zxF,
          x1P,y1P,z1P,x2P,y2P,z2P,m11P,m12P,m22P,cayley,smallestEV,jacobian,1);
      
      double norm = sqrt(pow(jacobian[0],2.0) + pow(jacobian[1],2.0) + pow(jacobian[2],2.0));
      cayley_t normalizedJacobian = (1/norm) * jacobian.transpose();
      
      cayley_t samplingPoint = cayley - lambda * normalizedJacobian;
      double samplingEV = ge::getCost(xxF,yyF,zzF,xyF,yzF,zxF,
          x1P,y1P,z1P,x2P,y2P,z2P,m11P,m12P,m22P,samplingPoint,1);
      
      if(print)
      {
        std::cout << iterations << ": " << samplingPoint.transpose();
        std::cout << " lambda: " << lambda << " EV: " << samplingEV << std::endl;
      }
      
      if( iterations == 0 || !disablingIncrements )
      {
        while( samplingEV < smallestEV )
        {
          smallestEV = samplingEV;
          if( lambda * modifier > maxLambda )
            break;
          lambda *= modifier;
          samplingPoint = cayley - lambda * normalizedJacobian;
          samplingEV = ge::getCost(xxF,yyF,zzF,xyF,yzF,zxF,
              x1P,y1P,z1P,x2P,y2P,z2P,m11P,m12P,m22P,samplingPoint,1);
          
          if(print)
          {
            std::cout << iterations << ": " << samplingPoint.transpose();
            std::cout << " lambda: " << lambda << " EV: " << samplingEV << std::endl;
          }
        }
      }
      
      while( samplingEV > smallestEV )
      {
        lambda /= modifier;
        samplingPoint = cayley - lambda * normalizedJacobian;
        samplingEV = ge::getCost(xxF,yyF,zzF,xyF,yzF,zxF,
            x1P,y1P,z1P,x2P,y2P,z2P,m11P,m12P,m22P,samplingPoint,1);
        
        if(print)
        {
          std::cout << iterations << ": " << samplingPoint.transpose();
          std::cout << " lambda: " << lambda << " EV: " << samplingEV << std::endl;
        }
      }
      
      //apply update
      cayley = samplingPoint;
      smallestEV = samplingEV;
      
      //stopping condition (check if the update was too small)
      if( lambda < min_xtol )
        break;
      
      iterations++;
    }
    
    //try to see if we can robustly identify each time we enter up in the wrong minimum
    if( cayley.norm() < 0.01 )
    {
      //we are close to the origin, test the EV 2
      double ev2 = ge::getCost(xxF,yyF,zzF,xyF,yzF,zxF,
            x1P,y1P,z1P,x2P,y2P,z2P,m11P,m12P,m22P,cayley,0);
      if( ev2 > 0.001 )
        randomTrialCount++;
      else
        found = true;
    }
    else
      found = true;
  }
  
  Eigen::Matrix4d G = ge::composeG(xxF,yyF,zzF,xyF,yzF,zxF,
      x1P,y1P,z1P,x2P,y2P,z2P,m11P,m12P,m22P,cayley);
  
  Eigen::EigenSolver< Eigen::Matrix4d > Eig(G,true);
  Eigen::Matrix<std::complex<double>,4,1> D_complex = Eig.eigenvalues();
  Eigen::Matrix<std::complex<double>,4,4> V_complex = Eig.eigenvectors();
  Eigen::Vector4d D;
  Eigen::Matrix4d V;
  for(size_t i = 0; i < 4; i++)
  {
    D[i] = D_complex[i].real();
    for(size_t j = 0; j < 4; j++)
      V(i,j) = V_complex(i,j).real();
  }

  double factor = V(3,0);
  Eigen::Vector4d t = (1.0/factor) * V.col(0);

  output.translation = t;
  output.rotation = math::cayley2rot(cayley);
  output.eigenvalues = D;
  output.eigenvectors = V;
}